

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

void __thiscall
CVmDynamicFunc::CVmDynamicFunc
          (CVmDynamicFunc *this,vm_obj_id_t self,vm_val_t *src,size_t bytecode_len,int obj_ref_cnt)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_dynfunc_ext *pvVar3;
  uint32_t tmp;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0035bc78;
  pvVar3 = vm_dynfunc_ext::alloc_ext(this,bytecode_len,obj_ref_cnt);
  (this->super_CVmObject).ext_ = (char *)pvVar3;
  if (src != (vm_val_t *)0x0) {
    uVar2 = *(undefined4 *)&src->field_0x4;
    aVar1 = src->val;
    (pvVar3->src).typ = src->typ;
    *(undefined4 *)&(pvVar3->src).field_0x4 = uVar2;
    (pvVar3->src).val = aVar1;
  }
  pvVar3->obj_refs[pvVar3->obj_ref_cnt] = self;
  return;
}

Assistant:

CVmDynamicFunc::CVmDynamicFunc(VMG_ vm_obj_id_t self, const vm_val_t *src,
                               size_t bytecode_len, int obj_ref_cnt)
{
    /* allocate our extension structure */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);

    /* store it in the object */
    ext_ = (char *)ext;
    
    /* save the source value */
    if (src != 0)
        ext->src = *src;

    /* set up the code object prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);
}